

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::torrent::on_disk_write_complete(torrent *this,storage_error *error,peer_request *p)

{
  _Atomic_word *p_Var1;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  piece_block block;
  piece_block block_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string_view job_name;
  piece_block block_finished;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_70;
  int iStack_6c;
  undefined1 local_68 [24];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  session_interface *local_38;
  pointer pppStack_30;
  uint local_28;
  
  counters::inc_stats_counter(this->m_stats_counters,0xfc,-(long)p->length);
  if (((this->super_torrent_hot_members).field_0x4b & 4) == 0) {
    local_70.m_val = (p->piece).m_val;
    iVar3 = (((this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_files).m_piece_length;
    iStack_6c = 0x4000;
    if (iVar3 < 0x4000) {
      iStack_6c = iVar3;
    }
    if (iVar3 < 1) {
      iStack_6c = 0x4000;
    }
    iStack_6c = p->start / iStack_6c;
    if ((error->ec).val_ == 0) {
      this_00._M_head_impl =
           (this->super_torrent_hot_members).m_picker._M_t.
           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
           ._M_t.
           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
      if (this_00._M_head_impl != (piece_picker *)0x0) {
        block.block_index = iStack_6c;
        block.piece_index.m_val = local_70.m_val;
        bVar2 = piece_picker::is_finished(this_00._M_head_impl,block);
        if (!bVar2) {
          block_00.block_index = iStack_6c;
          block_00.piece_index.m_val = local_70.m_val;
          piece_picker::mark_as_finished
                    ((this->super_torrent_hot_members).m_picker._M_t.
                     super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                     .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
                     block_00,(torrent_peer *)0x0);
          maybe_done_flushing(this);
          iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[5])();
          if ((*(uint *)(CONCAT44(extraout_var,iVar3) + 0x68) >> 0x18 & 1) != 0) {
            iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                      _vptr_session_logger[5])();
            get_handle((torrent *)local_68);
            uStack_50 = 0;
            uStack_4c = 0;
            uStack_48 = 0;
            uStack_44 = 0;
            local_68._16_8_ =
                 (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                  )0x2;
            local_38 = (session_interface *)0x0;
            pppStack_30 = (pointer)0x0;
            local_28 = 0;
            alert_manager::
            emplace_alert<libtorrent::block_finished_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,libtorrent::digest32<160l>,int_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                      ((alert_manager *)CONCAT44(extraout_var_00,iVar3),(torrent_handle *)local_68,
                       (basic_endpoint<boost::asio::ip::tcp> *)(local_68 + 0x10),
                       (digest32<160L> *)&local_38,&iStack_6c,&local_70);
            if ((_Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 )local_68._8_8_ != (piece_picker *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var1 = (_Atomic_word *)(local_68._8_8_ + 0xc);
                iVar3 = *p_Var1;
                *p_Var1 = *p_Var1 + -1;
                UNLOCK();
              }
              else {
                iVar3 = *(_Atomic_word *)(local_68._8_8_ + 0xc);
                *(int *)(local_68._8_8_ + 0xc) = iVar3 + -1;
              }
              if (iVar3 == 1) {
                (*(code *)(((vector<piece_pos,_piece_index_t> *)local_68._8_8_)->
                          super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ).
                          super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                          ._M_impl.super__Vector_impl_data._M_start[3])();
              }
            }
          }
        }
      }
    }
    else {
      job_name._M_str = "write";
      job_name._M_len = 5;
      handle_disk_error(this,job_name,error,(peer_connection *)0x0,none);
    }
  }
  return;
}

Assistant:

void torrent::on_disk_write_complete(storage_error const& error
		, peer_request const& p) try
	{
		TORRENT_ASSERT(is_single_thread());

		m_stats_counters.inc_stats_counter(counters::queued_write_bytes, -p.length);

//		std::fprintf(stderr, "torrent::on_disk_write_complete ret:%d piece:%d block:%d\n"
//			, j->ret, j->piece, j->offset/0x4000);

		INVARIANT_CHECK;
		if (m_abort) return;
		piece_block const block_finished(p.piece, p.start / block_size());

		if (error)
		{
			handle_disk_error("write", error);
			return;
		}

		if (!has_picker()) return;

		// if we already have this block, just ignore it.
		// this can happen if the same block is passed in through
		// add_piece() multiple times
		if (picker().is_finished(block_finished)) return;

		picker().mark_as_finished(block_finished, nullptr);
		maybe_done_flushing();

		if (alerts().should_post<block_finished_alert>())
		{
			alerts().emplace_alert<block_finished_alert>(get_handle(),
				tcp::endpoint(), peer_id(), block_finished.block_index
				, block_finished.piece_index);
		}
	}
	catch (...) { handle_exception(); }